

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O0

float Abc_NtkComputeEdgeDept(Abc_Obj_t *pFanout,int iFanin,float Slew)

{
  SC_Cell *pCell;
  float fVar1;
  float fVar2;
  float Edge;
  float Dept;
  float Load;
  float Slew_local;
  int iFanin_local;
  Abc_Obj_t *pFanout_local;
  
  fVar1 = Bus_SclObjLoad(pFanout);
  fVar2 = Bus_SclObjDept(pFanout);
  pCell = Abc_SclObjCell(pFanout);
  fVar1 = Scl_LibPinArrivalEstimate(pCell,iFanin,Slew,fVar1);
  if (0.0 < fVar1) {
    return fVar2 + fVar1;
  }
  __assert_fail("Edge > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBufSize.c"
                ,0xaf,"float Abc_NtkComputeEdgeDept(Abc_Obj_t *, int, float)");
}

Assistant:

static inline float Abc_NtkComputeEdgeDept( Abc_Obj_t * pFanout, int iFanin, float Slew )
{
    float Load = Bus_SclObjLoad( pFanout );
    float Dept = Bus_SclObjDept( pFanout );
    float Edge = Scl_LibPinArrivalEstimate( Abc_SclObjCell(pFanout), iFanin, Slew, Load );
    assert( Edge > 0 );
    return Dept + Edge;
}